

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_enumerate_devices__pulse
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  int iVar1;
  ma_result mVar2;
  uint uVar3;
  ma_pa_mainloop *pMainLoop;
  long lVar4;
  ma_pa_operation *pmVar5;
  ma_context_enumerate_devices_callback_data__pulse callbackData;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a9d,
                  "ma_result ma_context_enumerate_devices__pulse(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback == (ma_enum_devices_callback_proc)0x0) {
    __assert_fail("callback != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a9e,
                  "ma_result ma_context_enumerate_devices__pulse(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  callbackData.isTerminated = 0;
  callbackData.pContext = pContext;
  callbackData.callback = callback;
  callbackData.pUserData = pUserData;
  pMainLoop = (ma_pa_mainloop *)(*(pContext->field_21).alsa.snd_pcm_open)();
  mVar2 = -300;
  if (pMainLoop != (ma_pa_mainloop *)0x0) {
    lVar4 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)(pMainLoop);
    if ((lVar4 != 0) &&
       (lVar4 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_format_first)
                          (lVar4,(pContext->field_21).alsa.snd_pcm_mmap_commit), lVar4 != 0)) {
      iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_channels_near)
                        (lVar4,(pContext->field_21).alsa.snd_pcm_recover,
                         (ulong)((pContext->field_21).pulse.tryAutoSpawn == 0),0);
      if (iVar1 != 0) {
        (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(lVar4);
        (*(pContext->field_21).alsa.snd_pcm_close)(pMainLoop);
        mVar2 = ma_result_from_pulse(iVar1);
        return mVar2;
      }
      do {
        while( true ) {
          uVar3 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)(lVar4);
          if (uVar3 == 4) {
            pmVar5 = (ma_pa_operation *)
                     (*(pContext->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                               (lVar4,ma_context_enumerate_devices_sink_callback__pulse,
                                &callbackData);
            mVar2 = -1;
            if (pmVar5 != (ma_pa_operation *)0x0) {
              mVar2 = ma_wait_for_operation__pulse(pContext,pMainLoop,pmVar5);
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pmVar5);
              if ((mVar2 == 0 && callbackData.isTerminated == 0) &&
                 (pmVar5 = (ma_pa_operation *)
                           (*(pContext->field_21).alsa.snd_pcm_hw_params_set_access)
                                     (lVar4,ma_context_enumerate_devices_source_callback__pulse,
                                      &callbackData), mVar2 = -1, pmVar5 != (ma_pa_operation *)0x0))
              {
                mVar2 = ma_wait_for_operation__pulse(pContext,pMainLoop,pmVar5);
                (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pmVar5);
              }
            }
            goto LAB_0010b51d;
          }
          if (2 < uVar3 - 1) break;
          iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(pMainLoop,1,0);
          if (iVar1 < 0) {
            mVar2 = ma_result_from_pulse(iVar1);
            goto LAB_0010b51d;
          }
        }
      } while ((6 < uVar3) || ((0x61U >> (uVar3 & 0x1f) & 1) == 0));
      mVar2 = 0;
LAB_0010b51d:
      (*(pContext->field_21).alsa.snd_pcm_hw_params_set_rate_resample)(lVar4);
      (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(lVar4);
    }
    (*(pContext->field_21).alsa.snd_pcm_close)(pMainLoop);
  }
  return mVar2;
}

Assistant:

static ma_result ma_context_enumerate_devices__pulse(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_result result = MA_SUCCESS;
    ma_context_enumerate_devices_callback_data__pulse callbackData;
    ma_pa_operation* pOP = NULL;
    ma_pa_mainloop* pMainLoop;
    ma_pa_mainloop_api* pAPI;
    ma_pa_context* pPulseContext;
    int error;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    callbackData.pContext = pContext;
    callbackData.callback = callback;
    callbackData.pUserData = pUserData;
    callbackData.isTerminated = MA_FALSE;

    pMainLoop = ((ma_pa_mainloop_new_proc)pContext->pulse.pa_mainloop_new)();
    if (pMainLoop == NULL) {
        return MA_FAILED_TO_INIT_BACKEND;
    }

    pAPI = ((ma_pa_mainloop_get_api_proc)pContext->pulse.pa_mainloop_get_api)(pMainLoop);
    if (pAPI == NULL) {
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return MA_FAILED_TO_INIT_BACKEND;
    }

    pPulseContext = ((ma_pa_context_new_proc)pContext->pulse.pa_context_new)(pAPI, pContext->pulse.pApplicationName);
    if (pPulseContext == NULL) {
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return MA_FAILED_TO_INIT_BACKEND;
    }

    error = ((ma_pa_context_connect_proc)pContext->pulse.pa_context_connect)(pPulseContext, pContext->pulse.pServerName, (pContext->pulse.tryAutoSpawn) ? 0 : MA_PA_CONTEXT_NOAUTOSPAWN, NULL);
    if (error != MA_PA_OK) {
        ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)(pPulseContext);
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        return ma_result_from_pulse(error);
    }

    for (;;) {
        ma_pa_context_state_t state = ((ma_pa_context_get_state_proc)pContext->pulse.pa_context_get_state)(pPulseContext);
        if (state == MA_PA_CONTEXT_READY) {
            break;  /* Success. */
        }
        if (state == MA_PA_CONTEXT_CONNECTING || state == MA_PA_CONTEXT_AUTHORIZING || state == MA_PA_CONTEXT_SETTING_NAME) {
            error = ((ma_pa_mainloop_iterate_proc)pContext->pulse.pa_mainloop_iterate)(pMainLoop, 1, NULL);
            if (error < 0) {
                result = ma_result_from_pulse(error);
                goto done;
            }

#ifdef MA_DEBUG_OUTPUT
            printf("[PulseAudio] pa_context_get_state() returned %d. Waiting.\n", state);
#endif
            continue;   /* Keep trying. */
        }
        if (state == MA_PA_CONTEXT_UNCONNECTED || state == MA_PA_CONTEXT_FAILED || state == MA_PA_CONTEXT_TERMINATED) {
#ifdef MA_DEBUG_OUTPUT
            printf("[PulseAudio] pa_context_get_state() returned %d. Failed.\n", state);
#endif
            goto done;  /* Failed. */
        }
    }


    /* Playback. */
    if (!callbackData.isTerminated) {
        pOP = ((ma_pa_context_get_sink_info_list_proc)pContext->pulse.pa_context_get_sink_info_list)(pPulseContext, ma_context_enumerate_devices_sink_callback__pulse, &callbackData);
        if (pOP == NULL) {
            result = MA_ERROR;
            goto done;
        }

        result = ma_wait_for_operation__pulse(pContext, pMainLoop, pOP);
        ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);
        if (result != MA_SUCCESS) {
            goto done;
        }
    }


    /* Capture. */
    if (!callbackData.isTerminated) {
        pOP = ((ma_pa_context_get_source_info_list_proc)pContext->pulse.pa_context_get_source_info_list)(pPulseContext, ma_context_enumerate_devices_source_callback__pulse, &callbackData);
        if (pOP == NULL) {
            result = MA_ERROR;
            goto done;
        }

        result = ma_wait_for_operation__pulse(pContext, pMainLoop, pOP);
        ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);
        if (result != MA_SUCCESS) {
            goto done;
        }
    }

done:
    ((ma_pa_context_disconnect_proc)pContext->pulse.pa_context_disconnect)(pPulseContext);
    ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)(pPulseContext);
    ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
    return result;
}